

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

vector<Player_*,_std::allocator<Player_*>_> *
initPlayers(int numPlayers,Map *map,vector<char,_std::allocator<char>_> *playerRoles)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  __first;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  __last;
  __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_> __first_00;
  __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_> __last_00;
  uint uVar2;
  reference ppCVar3;
  vector<Player_*,_std::allocator<Player_*>_> *this;
  Player *this_00;
  Hand *this_01;
  DiceRoller *this_02;
  reference pvVar4;
  ostream *poVar5;
  StatsObserver *this_03;
  PhaseObserver *this_04;
  uint uVar6;
  Strategies strat;
  size_type sVar7;
  unsigned_long i;
  ulong __n;
  bool bVar8;
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  countriesPerPlayer;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *countries;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  countriesPerPlayer.
  super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  countriesPerPlayer.
  super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  countriesPerPlayer.
  super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar7 = (size_type)numPlayers;
  std::
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ::reserve(&countriesPerPlayer,sVar7);
  uVar2 = 0;
  if (0 < numPlayers) {
    uVar2 = numPlayers;
  }
  uVar6 = uVar2;
  while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
    countries = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
    (countries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (countries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (countries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::reserve
              (countries,
               (long)(map->pMapCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(map->pMapCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::
    vector<std::vector<Map::Country*,std::allocator<Map::Country*>>*,std::allocator<std::vector<Map::Country*,std::allocator<Map::Country*>>*>>
    ::emplace_back<std::vector<Map::Country*,std::allocator<Map::Country*>>*&>
              ((vector<std::vector<Map::Country*,std::allocator<Map::Country*>>*,std::allocator<std::vector<Map::Country*,std::allocator<Map::Country*>>*>>
                *)&countriesPerPlayer,&countries);
  }
  pvVar1 = map->pMapCountries;
  __first._M_current =
       (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar6 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)&countries,(ulong)uVar6);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Map::Country**,std::vector<Map::Country*,std::allocator<Map::Country*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first,__last,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&countries);
  std::random_device::~random_device((random_device *)&local_13b8.field_0);
  for (__n = 0; __n < (ulong)((long)(pvVar1->
                                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar1->
                                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar1,__n);
    countries = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)*ppCVar3;
    *((value_type)countries)->pPlayerOwnerId =
         (int)((long)((ulong)(uint)((int)__n >> 0x1f) << 0x20 | __n & 0xffffffff) % (long)numPlayers
              );
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
              (countriesPerPlayer.
               super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[__n % sVar7],(value_type *)&countries);
  }
  this = (vector<Player_*,_std::allocator<Player_*>_> *)operator_new(0x18);
  (this->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Player_*,_std::allocator<Player_*>_>::reserve(this,sVar7);
  for (sVar7 = 0; uVar2 != sVar7; sVar7 = sVar7 + 1) {
    this_00 = (Player *)operator_new(0x38);
    pvVar1 = countriesPerPlayer.
             super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar7];
    this_01 = (Hand *)operator_new(8);
    Hand::Hand(this_01);
    this_02 = (DiceRoller *)operator_new(0x10);
    DiceRoller::DiceRoller(this_02);
    Player::Player(this_00,pvVar1,this_01,this_02,(int)sVar7);
    local_13b8._M_mt._M_x[0]._0_1_ = '\0';
    countries = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)this_00;
    if ((playerRoles->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (playerRoles->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar5 = std::operator<<((ostream *)&std::cout,"What strategy should player ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)sVar7);
      poVar5 = std::operator<<(poVar5," use? a) Human b) aggresive c) passive d) random e) cheater")
      ;
      std::endl<char,std::char_traits<char>>(poVar5);
      std::operator>>((istream *)&std::cin,(char *)&local_13b8);
    }
    else {
      pvVar4 = std::vector<char,_std::allocator<char>_>::at(playerRoles,sVar7);
      local_13b8._M_mt._M_x[0]._0_1_ = *pvVar4 + '\x01';
    }
    strat = (byte)(local_13b8._M_mt._M_x[0]._0_1_ + 0x9e) + AGGRESSIVE_BOT;
    if (3 < (byte)(local_13b8._M_mt._M_x[0]._0_1_ + 0x9e)) {
      strat = HUMAN_PLAYER;
    }
    Player::setPlayerStrategy((Player *)countries,strat);
    this_03 = (StatsObserver *)operator_new(0x10);
    StatsObserver::StatsObserver(this_03,(Player *)countries);
    this_04 = (PhaseObserver *)operator_new(0x10);
    PhaseObserver::PhaseObserver(this_04,(Player *)countries);
    std::vector<Player_*,_std::allocator<Player_*>_>::push_back(this,(value_type *)&countries);
  }
  __first_00._M_current =
       (this->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last_00._M_current =
       (this->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)&countries,(ulong)uVar2);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Player**,std::vector<Player*,std::allocator<Player*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first_00,__last_00,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&countries);
  std::random_device::~random_device((random_device *)&local_13b8.field_0);
  std::
  _Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ::~_Vector_base(&countriesPerPlayer.
                   super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
                 );
  return this;
}

Assistant:

static vector<Player*>* initPlayers(int numPlayers, Map* map, vector<char> playerRoles = {}) {
    vector<vector<Map::Country*>*> countriesPerPlayer;
    countriesPerPlayer.reserve(numPlayers);
    //split up the countries by the number of players
    for (int i = 0; i < numPlayers; i++) {
        auto* countries = new vector<Map::Country*>();
        countries->reserve(map->getMapCountries()->size());
        countriesPerPlayer.emplace_back(countries);
    }
    //randomize map countries
    vector<Map::Country*>* randomizedCountries = map->getMapCountries();
    std::shuffle(randomizedCountries->begin(), randomizedCountries->end(), std::mt19937(std::random_device()()));
    for (unsigned long i = 0; i < randomizedCountries->size(); i++) {
        Map::Country* currCountry = randomizedCountries->at(i);
        currCountry->setPlayerOwnerID(int(i) % numPlayers);
        countriesPerPlayer[i % numPlayers]->push_back(currCountry);
    }

    auto* players = new vector<Player*>();
    players->reserve(numPlayers);
    //create the players with their respective list of countries created above
    for (int i = 0; i < numPlayers; i++) {
        auto* player = new Player(countriesPerPlayer[i], new Hand(), new DiceRoller(), i);

        char strat = 0;

        //support tournament role
        if (playerRoles.empty()) {
            std::cout << "What strategy should player " << i
                      << " use? a) Human b) aggresive c) passive d) random e) cheater" << std::endl;
            std::cin >> strat;
        } else {
            //increment to match with switch case bellow
            strat = playerRoles.at(i);
            strat++;
        }

        switch (strat) {
            case 'a':
                player->setPlayerStrategy(Strategies::HUMAN_PLAYER);
                break;
            case 'b':
                player->setPlayerStrategy(Strategies::AGGRESSIVE_BOT);
                break;
            case 'c':
                player->setPlayerStrategy(Strategies::BENEVOLENT_BOT);
                break;
            case 'd':
                player->setPlayerStrategy(Strategies::RANDOM_BOT);
                break;
            case 'e':
                player->setPlayerStrategy(Strategies::CHEATER_BOT);
                break;
            default: {
                player->setPlayerStrategy(Strategies::HUMAN_PLAYER);
                break;
            }
        }
        new StatsObserver(player);
        new PhaseObserver(player);
        players->push_back(player);
    }
    std::shuffle(players->begin(), players->end(), std::mt19937(std::random_device()()));
    return players;
}